

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

int opengv::absolute_pose::modules::gpnp2::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 (*in_stack_00000008) [16];
  undefined1 (*in_stack_00000010) [16];
  
  auVar13 = *in_R8;
  auVar14 = *in_R9;
  auVar15 = vsubpd_avx(auVar13,auVar14);
  dVar1 = *(double *)in_R8[1];
  dVar2 = *(double *)in_R9[1];
  auVar16 = vsubpd_avx(auVar13,*in_stack_00000008);
  dVar9 = dVar1 - *(double *)in_stack_00000008[1];
  auVar17 = vsubpd_avx(auVar13,*in_stack_00000010);
  dVar10 = dVar1 - *(double *)in_stack_00000010[1];
  auVar18 = vsubpd_avx(auVar14,*in_stack_00000008);
  dVar11 = dVar2 - *(double *)in_stack_00000008[1];
  auVar14 = vsubpd_avx(auVar14,*in_stack_00000010);
  dVar12 = dVar2 - *(double *)in_stack_00000010[1];
  dVar3 = *in_RCX;
  dVar4 = in_RCX[1];
  dVar5 = in_RCX[3];
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar5;
  dVar6 = in_RCX[4];
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dVar3 * -2.0;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = dVar4 * -2.0 * dVar6;
  auVar13 = vfmadd231sd_fma(auVar349,auVar284,auVar228);
  dVar7 = in_RCX[2];
  dVar8 = in_RCX[5];
  auVar376._8_8_ = 0;
  auVar376._0_8_ = dVar8;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = dVar7 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar389,auVar376,auVar13);
  *(double *)ctx =
       dVar8 * dVar8 +
       dVar7 * dVar7 + dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + auVar13._0_8_ + dVar3 * dVar3
  ;
  dVar3 = *in_RDX;
  dVar4 = in_RDX[1];
  auVar285._8_8_ = 0;
  auVar285._0_8_ = in_RCX[3];
  auVar322._8_8_ = 0;
  auVar322._0_8_ = *in_RCX;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = in_RCX[1];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = in_RCX[3] * dVar3 * -2.0;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd231sd_fma(auVar134,auVar322,auVar229);
  dVar3 = in_RDX[3];
  auVar230._8_8_ = 0;
  auVar230._0_8_ = dVar3;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = *in_RCX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar323,auVar230,auVar13);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar135,auVar285,auVar13);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar231,auVar350,auVar13);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = in_RCX[4];
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar4 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar184,auVar136,auVar13);
  dVar3 = in_RDX[4];
  auVar232._8_8_ = 0;
  auVar232._0_8_ = dVar3;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = in_RCX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar286,auVar232,auVar13);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar185,auVar136,auVar13);
  dVar3 = in_RDX[2];
  auVar287._8_8_ = 0;
  auVar287._0_8_ = in_RCX[2];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar233,auVar287,auVar13);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = in_RCX[5];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar137,auVar186,auVar13);
  dVar3 = in_RDX[5];
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar3;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = in_RCX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar288,auVar234,auVar13);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar138,auVar186,auVar13);
  *(long *)(ctx + 0x50) = auVar13._0_8_;
  dVar3 = *in_RDX;
  dVar4 = in_RDX[1];
  dVar5 = in_RDX[3];
  auVar289._8_8_ = 0;
  auVar289._0_8_ = dVar5;
  dVar6 = in_RDX[4];
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar3 * -2.0;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar4 * -2.0 * dVar6;
  auVar13 = vfmadd231sd_fma(auVar351,auVar289,auVar235);
  dVar7 = in_RDX[2];
  dVar8 = in_RDX[5];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = dVar8;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = dVar7 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar390,auVar377,auVar13);
  *(double *)(ctx + 0xa0) =
       dVar8 * dVar8 +
       dVar7 * dVar7 + dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + auVar13._0_8_ + dVar3 * dVar3
  ;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar290._8_8_ = 0;
  auVar290._0_8_ = in_RCX[3];
  auVar324._8_8_ = 0;
  auVar324._0_8_ = *in_RCX;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = in_RCX[1];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = in_RCX[3] * dVar3 * -2.0;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd231sd_fma(auVar139,auVar324,auVar236);
  dVar3 = in_RSI[3];
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar3;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = *in_RCX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar325,auVar237,auVar13);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar140,auVar290,auVar13);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar238,auVar352,auVar13);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = in_RCX[4];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar4 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar187,auVar141,auVar13);
  dVar3 = in_RSI[4];
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar3;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = in_RCX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar291,auVar239,auVar13);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar188,auVar141,auVar13);
  dVar3 = in_RSI[2];
  auVar292._8_8_ = 0;
  auVar292._0_8_ = in_RCX[2];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar240,auVar292,auVar13);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = in_RCX[5];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar142,auVar189,auVar13);
  dVar3 = in_RSI[5];
  auVar241._8_8_ = 0;
  auVar241._0_8_ = dVar3;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = in_RCX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar293,auVar241,auVar13);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar143,auVar189,auVar13);
  *(long *)(ctx + 0xf0) = auVar13._0_8_;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar294._8_8_ = 0;
  auVar294._0_8_ = in_RDX[3];
  auVar326._8_8_ = 0;
  auVar326._0_8_ = *in_RDX;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = in_RDX[1];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = in_RDX[3] * dVar3 * -2.0;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd231sd_fma(auVar144,auVar326,auVar242);
  dVar3 = in_RSI[3];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar3;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = *in_RDX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar327,auVar243,auVar13);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar145,auVar294,auVar13);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar244,auVar353,auVar13);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = in_RDX[4];
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar4 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar190,auVar146,auVar13);
  dVar3 = in_RSI[4];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = dVar3;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = in_RDX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar295,auVar245,auVar13);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar191,auVar146,auVar13);
  dVar3 = in_RSI[2];
  auVar296._8_8_ = 0;
  auVar296._0_8_ = in_RDX[2];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar246,auVar296,auVar13);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = in_RDX[5];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar147,auVar192,auVar13);
  dVar3 = in_RSI[5];
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar3;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = in_RDX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar297,auVar247,auVar13);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar148,auVar192,auVar13);
  *(long *)(ctx + 0x140) = auVar13._0_8_;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       (dVar1 - dVar2) * (dVar1 - dVar2) +
       auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar13 = vsqrtsd_avx(auVar87,auVar87);
  dVar1 = in_RSI[3];
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dVar1;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar3 * dVar3 - auVar13._0_8_ * auVar13._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar149,auVar248,auVar88);
  dVar2 = in_RSI[4];
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar4 * dVar4 + dVar1 * dVar1 + auVar13._0_8_;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar4 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar193,auVar150,auVar89);
  dVar1 = in_RSI[2];
  dVar3 = in_RSI[5];
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar3;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + auVar13._0_8_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar151,auVar194,auVar90);
  *(double *)(ctx + 400) = dVar3 * dVar3 + auVar13._0_8_;
  dVar1 = *in_RCX;
  dVar2 = in_RCX[1];
  dVar3 = in_RCX[6];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar3;
  dVar4 = in_RCX[7];
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar1 * -2.0;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar328,auVar249,auVar195);
  dVar5 = in_RCX[2];
  dVar6 = in_RCX[8];
  auVar354._8_8_ = 0;
  auVar354._0_8_ = dVar6;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar378,auVar354,auVar13);
  *(double *)(ctx + 8) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *in_RCX;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar1 + dVar1;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = (dVar2 + dVar2) * in_RCX[1];
  auVar13 = vfmadd231sd_fma(auVar250,auVar298,auVar196);
  dVar3 = in_RDX[2];
  auVar379._8_8_ = 0;
  auVar379._0_8_ = in_RCX[2];
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar355,auVar379,auVar13);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = in_RCX[6];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar91,auVar251,auVar13);
  dVar1 = in_RDX[6];
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar1;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *in_RCX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar299,auVar356,auVar13);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar92,auVar251,auVar13);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = in_RCX[7];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar152,auVar252,auVar13);
  dVar1 = in_RDX[7];
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar1;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = in_RCX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar300,auVar93,auVar13);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar94,auVar252,auVar13);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = in_RCX[8];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar197,auVar153,auVar13);
  dVar1 = in_RDX[8];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar1;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = in_RCX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar253,auVar95,auVar13);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar96,auVar153,auVar13);
  *(long *)(ctx + 0x58) = auVar13._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  dVar3 = in_RDX[6];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar3;
  dVar4 = in_RDX[7];
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar1 * -2.0;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar329,auVar254,auVar198);
  dVar5 = in_RDX[2];
  dVar6 = in_RDX[8];
  auVar357._8_8_ = 0;
  auVar357._0_8_ = dVar6;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar380,auVar357,auVar13);
  *(double *)(ctx + 0xa8) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar301._8_8_ = 0;
  auVar301._0_8_ = *in_RCX;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar1 + dVar1;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = (dVar2 + dVar2) * in_RCX[1];
  auVar13 = vfmadd231sd_fma(auVar255,auVar301,auVar199);
  dVar3 = in_RSI[2];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = in_RCX[2];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar358,auVar381,auVar13);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = in_RCX[6];
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar97,auVar256,auVar13);
  dVar1 = in_RSI[6];
  auVar359._8_8_ = 0;
  auVar359._0_8_ = dVar1;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = *in_RCX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar302,auVar359,auVar13);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar98,auVar256,auVar13);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = in_RCX[7];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar154,auVar257,auVar13);
  dVar1 = in_RSI[7];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar1;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = in_RCX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar303,auVar99,auVar13);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar100,auVar257,auVar13);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = in_RCX[8];
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar200,auVar155,auVar13);
  dVar1 = in_RSI[8];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar1;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = in_RCX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar258,auVar101,auVar13);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar102,auVar155,auVar13);
  *(long *)(ctx + 0xf8) = auVar13._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar304._8_8_ = 0;
  auVar304._0_8_ = *in_RDX;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar1 + dVar1;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = (dVar2 + dVar2) * in_RDX[1];
  auVar13 = vfmadd231sd_fma(auVar259,auVar304,auVar201);
  dVar3 = in_RSI[2];
  auVar382._8_8_ = 0;
  auVar382._0_8_ = in_RDX[2];
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar360,auVar382,auVar13);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = in_RDX[6];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar103,auVar260,auVar13);
  dVar1 = in_RSI[6];
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar1;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = *in_RDX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar305,auVar361,auVar13);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar104,auVar260,auVar13);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = in_RDX[7];
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar156,auVar261,auVar13);
  dVar1 = in_RSI[7];
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar1;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = in_RDX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar306,auVar105,auVar13);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar106,auVar261,auVar13);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = in_RDX[8];
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar202,auVar157,auVar13);
  dVar1 = in_RSI[8];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar1;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = in_RDX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar262,auVar107,auVar13);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar108,auVar157,auVar13);
  *(long *)(ctx + 0x148) = auVar13._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar9 * dVar9 + auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
  auVar13 = vsqrtsd_avx(auVar51,auVar51);
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[6];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar4;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar3 * dVar3 + (dVar1 * dVar1 - auVar13._0_8_ * auVar13._0_8_) + dVar2 * dVar2;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar109,auVar263,auVar52);
  dVar1 = in_RSI[7];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar4 * dVar4 + auVar13._0_8_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar158,auVar110,auVar53);
  dVar2 = in_RSI[8];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar1 * dVar1 + auVar13._0_8_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar159,auVar111,auVar54);
  *(double *)(ctx + 0x198) = dVar2 * dVar2 + auVar13._0_8_;
  dVar1 = *in_RCX;
  dVar2 = in_RCX[1];
  dVar3 = in_RCX[9];
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar3;
  dVar4 = in_RCX[10];
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dVar1 * -2.0;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar307,auVar203,auVar160);
  dVar5 = in_RCX[2];
  dVar6 = in_RCX[0xb];
  auVar330._8_8_ = 0;
  auVar330._0_8_ = dVar6;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar362,auVar330,auVar13);
  *(double *)(ctx + 0x10) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *in_RCX;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar1 + dVar1;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = in_RCX[1] * (dVar2 + dVar2);
  auVar13 = vfmadd231sd_fma(auVar204,auVar264,auVar161);
  dVar3 = in_RDX[2];
  auVar363._8_8_ = 0;
  auVar363._0_8_ = in_RCX[2];
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar331,auVar363,auVar13);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = in_RCX[9];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar55,auVar205,auVar13);
  dVar1 = in_RDX[9];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = dVar1;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *in_RCX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar265,auVar332,auVar13);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar56,auVar205,auVar13);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = in_RCX[10];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar112,auVar206,auVar13);
  dVar1 = in_RDX[10];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar1;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = in_RCX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar266,auVar57,auVar13);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar58,auVar206,auVar13);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = in_RCX[0xb];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar162,auVar113,auVar13);
  dVar1 = in_RDX[0xb];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = in_RCX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar207,auVar59,auVar13);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar60,auVar113,auVar13);
  *(long *)(ctx + 0x60) = auVar13._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  dVar3 = in_RDX[9];
  auVar208._8_8_ = 0;
  auVar208._0_8_ = dVar3;
  dVar4 = in_RDX[10];
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar1 * -2.0;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar308,auVar208,auVar163);
  dVar5 = in_RDX[2];
  dVar6 = in_RDX[0xb];
  auVar333._8_8_ = 0;
  auVar333._0_8_ = dVar6;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar364,auVar333,auVar13);
  *(double *)(ctx + 0xb0) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *in_RCX;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar1 + dVar1;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = in_RCX[1] * (dVar2 + dVar2);
  auVar13 = vfmadd231sd_fma(auVar209,auVar267,auVar164);
  dVar3 = in_RSI[2];
  auVar365._8_8_ = 0;
  auVar365._0_8_ = in_RCX[2];
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar334,auVar365,auVar13);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = in_RCX[9];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar61,auVar210,auVar13);
  dVar1 = in_RSI[9];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dVar1;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *in_RCX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar268,auVar335,auVar13);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar62,auVar210,auVar13);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = in_RCX[10];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar114,auVar211,auVar13);
  dVar1 = in_RSI[10];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = in_RCX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar269,auVar63,auVar13);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar64,auVar211,auVar13);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = in_RCX[0xb];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar165,auVar115,auVar13);
  dVar1 = in_RSI[0xb];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar1;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = in_RCX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar212,auVar65,auVar13);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar66,auVar115,auVar13);
  *(long *)(ctx + 0x100) = auVar13._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *in_RDX;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar1 + dVar1;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = in_RDX[1] * (dVar2 + dVar2);
  auVar13 = vfmadd231sd_fma(auVar213,auVar270,auVar166);
  dVar3 = in_RSI[2];
  auVar366._8_8_ = 0;
  auVar366._0_8_ = in_RDX[2];
  auVar336._8_8_ = 0;
  auVar336._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar336,auVar366,auVar13);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = in_RDX[9];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar67,auVar214,auVar13);
  dVar1 = in_RSI[9];
  auVar337._8_8_ = 0;
  auVar337._0_8_ = dVar1;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *in_RDX * -2.0;
  auVar13 = vfmadd213sd_fma(auVar271,auVar337,auVar13);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar68,auVar214,auVar13);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = in_RDX[10];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar116,auVar215,auVar13);
  dVar1 = in_RSI[10];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = in_RDX[1] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar272,auVar69,auVar13);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar70,auVar215,auVar13);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = in_RDX[0xb];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar167,auVar117,auVar13);
  dVar1 = in_RSI[0xb];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = in_RDX[2] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar216,auVar71,auVar13);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar72,auVar117,auVar13);
  *(long *)(ctx + 0x150) = auVar13._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar10 * dVar10 + auVar17._0_8_ * auVar17._0_8_ + auVar17._8_8_ * auVar17._8_8_;
  auVar13 = vsqrtsd_avx(auVar30,auVar30);
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[9];
  auVar217._8_8_ = 0;
  auVar217._0_8_ = dVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (dVar1 * dVar1 - auVar13._0_8_ * auVar13._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar73,auVar217,auVar31);
  dVar1 = in_RSI[10];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar4 * dVar4 + auVar13._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar118,auVar74,auVar32);
  dVar2 = in_RSI[0xb];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 * dVar1 + auVar13._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar119,auVar75,auVar33);
  *(double *)(ctx + 0x1a0) = dVar2 * dVar2 + auVar13._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  dVar3 = in_RCX[6];
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar3;
  dVar4 = in_RCX[7];
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar1 * -2.0;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar273,auVar168,auVar120);
  dVar5 = in_RCX[5];
  dVar6 = in_RCX[8];
  auVar309._8_8_ = 0;
  auVar309._0_8_ = dVar6;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar338,auVar309,auVar13);
  *(double *)(ctx + 0x18) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = in_RCX[3];
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar1 + dVar1;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = in_RCX[4] * (dVar2 + dVar2);
  auVar13 = vfmadd231sd_fma(auVar169,auVar218,auVar121);
  dVar3 = in_RDX[5];
  auVar339._8_8_ = 0;
  auVar339._0_8_ = in_RCX[5];
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar310,auVar339,auVar13);
  dVar4 = in_RDX[6];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar4;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = in_RCX[6];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar367,auVar383,auVar13);
  dVar4 = in_RDX[7];
  auVar311._8_8_ = 0;
  auVar311._0_8_ = dVar4;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = in_RCX[7];
  auVar391._8_8_ = 0;
  auVar391._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar391,auVar397,auVar13);
  dVar4 = in_RDX[8];
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar4;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = dVar4 + dVar4;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = in_RCX[8];
  auVar13 = vfmadd213sd_avx512f(auVar403,auVar409,auVar13);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar34,auVar383,auVar13);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = in_RCX[3] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar219,auVar170,auVar13);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar35,auVar397,auVar13);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = in_RCX[4] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar76,auVar311,auVar13);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_avx512f(auVar36,auVar409,auVar13);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = in_RCX[5] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar77,auVar368,auVar13);
  *(long *)(ctx + 0x68) = auVar13._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  dVar3 = in_RDX[6];
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar3;
  dVar4 = in_RDX[7];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = dVar1 * -2.0;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar274,auVar171,auVar122);
  dVar5 = in_RDX[5];
  dVar6 = in_RDX[8];
  auVar312._8_8_ = 0;
  auVar312._0_8_ = dVar6;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar340,auVar312,auVar13);
  *(double *)(ctx + 0xb8) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar220._8_8_ = 0;
  auVar220._0_8_ = in_RCX[3];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar1 + dVar1;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = in_RCX[4] * (dVar2 + dVar2);
  auVar13 = vfmadd231sd_fma(auVar172,auVar220,auVar123);
  dVar3 = in_RSI[5];
  auVar341._8_8_ = 0;
  auVar341._0_8_ = in_RCX[5];
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar313,auVar341,auVar13);
  dVar4 = in_RSI[6];
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar4;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = in_RCX[6];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar369,auVar384,auVar13);
  dVar4 = in_RSI[7];
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar4;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = in_RCX[7];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar392,auVar398,auVar13);
  dVar4 = in_RSI[8];
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar4;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar4 + dVar4;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = in_RCX[8];
  auVar13 = vfmadd213sd_avx512f(auVar404,auVar410,auVar13);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar37,auVar384,auVar13);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = in_RCX[3] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar221,auVar173,auVar13);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar38,auVar398,auVar13);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = in_RCX[4] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar78,auVar314,auVar13);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_avx512f(auVar39,auVar410,auVar13);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = in_RCX[5] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar79,auVar370,auVar13);
  *(long *)(ctx + 0x108) = auVar13._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar222._8_8_ = 0;
  auVar222._0_8_ = in_RDX[3];
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar1 + dVar1;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = in_RDX[4] * (dVar2 + dVar2);
  auVar13 = vfmadd231sd_fma(auVar174,auVar222,auVar124);
  dVar3 = in_RSI[5];
  auVar342._8_8_ = 0;
  auVar342._0_8_ = in_RDX[5];
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar315,auVar342,auVar13);
  dVar4 = in_RSI[6];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar4;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = in_RDX[6];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar371,auVar385,auVar13);
  dVar4 = in_RSI[7];
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar4;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = in_RDX[7];
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar393,auVar399,auVar13);
  dVar4 = in_RSI[8];
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dVar4;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = dVar4 + dVar4;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = in_RDX[8];
  auVar13 = vfmadd213sd_avx512f(auVar405,auVar411,auVar13);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar40,auVar385,auVar13);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = in_RDX[3] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar223,auVar175,auVar13);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar41,auVar399,auVar13);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = in_RDX[4] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar80,auVar316,auVar13);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_avx512f(auVar42,auVar411,auVar13);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = in_RDX[5] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar81,auVar372,auVar13);
  *(long *)(ctx + 0x158) = auVar13._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar11 * dVar11 + auVar18._0_8_ * auVar18._0_8_ + auVar18._8_8_ * auVar18._8_8_;
  auVar13 = vsqrtsd_avx(auVar17,auVar17);
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[6];
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar4;
  dVar5 = in_RSI[7];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = dVar5;
  dVar6 = in_RSI[8];
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar6;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       dVar6 * dVar6 +
       dVar5 * dVar5 +
       (dVar1 * dVar1 - auVar13._0_8_ * auVar13._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar43,auVar176,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar19,auVar224,auVar13);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar44,auVar275,auVar13);
  *(long *)(ctx + 0x1a8) = auVar13._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  dVar3 = in_RCX[9];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar3;
  dVar4 = in_RCX[10];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar1 * -2.0;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar225,auVar125,auVar82);
  dVar5 = in_RCX[5];
  dVar6 = in_RCX[0xb];
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar6;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar317,auVar276,auVar13);
  *(double *)(ctx + 0x20) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = in_RCX[3];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar1 + dVar1;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = (dVar2 + dVar2) * in_RCX[4];
  auVar13 = vfmadd231sd_fma(auVar126,auVar177,auVar83);
  dVar3 = in_RDX[5];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = in_RCX[5];
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar277,auVar318,auVar13);
  dVar4 = in_RDX[9];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar4;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = in_RCX[9];
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar343,auVar373,auVar13);
  dVar4 = in_RDX[10];
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dVar4;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = in_RCX[10];
  auVar386._8_8_ = 0;
  auVar386._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar386,auVar394,auVar13);
  dVar4 = in_RDX[0xb];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar4;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = in_RCX[0xb];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar400,auVar406,auVar13);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar20,auVar373,auVar13);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = in_RCX[3] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar178,auVar127,auVar13);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar21,auVar394,auVar13);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = in_RCX[4] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar45,auVar278,auVar13);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar22,auVar406,auVar13);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = in_RCX[5] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar46,auVar344,auVar13);
  *(long *)(ctx + 0x70) = auVar13._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  dVar3 = in_RDX[9];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar3;
  dVar4 = in_RDX[10];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar1 * -2.0;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = dVar2 * -2.0 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar226,auVar128,auVar84);
  dVar5 = in_RDX[5];
  dVar6 = in_RDX[0xb];
  auVar279._8_8_ = 0;
  auVar279._0_8_ = dVar6;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = dVar5 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar319,auVar279,auVar13);
  *(double *)(ctx + 0xc0) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar13._0_8_ + dVar1 * dVar1
  ;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = in_RCX[3];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar1 + dVar1;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = (dVar2 + dVar2) * in_RCX[4];
  auVar13 = vfmadd231sd_fma(auVar129,auVar179,auVar85);
  dVar3 = in_RSI[5];
  auVar320._8_8_ = 0;
  auVar320._0_8_ = in_RCX[5];
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar280,auVar320,auVar13);
  dVar4 = in_RSI[9];
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar4;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = in_RCX[9];
  auVar345._8_8_ = 0;
  auVar345._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar345,auVar374,auVar13);
  dVar4 = in_RSI[10];
  auVar281._8_8_ = 0;
  auVar281._0_8_ = dVar4;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = in_RCX[10];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar387,auVar395,auVar13);
  dVar4 = in_RSI[0xb];
  auVar346._8_8_ = 0;
  auVar346._0_8_ = dVar4;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = in_RCX[0xb];
  auVar401._8_8_ = 0;
  auVar401._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar401,auVar407,auVar13);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar23,auVar374,auVar13);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = in_RCX[3] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar180,auVar130,auVar13);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar24,auVar395,auVar13);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = in_RCX[4] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar47,auVar281,auVar13);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar25,auVar407,auVar13);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = in_RCX[5] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar48,auVar346,auVar13);
  *(long *)(ctx + 0x110) = auVar13._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar181._8_8_ = 0;
  auVar181._0_8_ = in_RDX[3];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar1 + dVar1;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = (dVar2 + dVar2) * in_RDX[4];
  auVar13 = vfmadd231sd_fma(auVar131,auVar181,auVar86);
  dVar3 = in_RSI[5];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = in_RDX[5];
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dVar3 + dVar3;
  auVar13 = vfmadd213sd_fma(auVar282,auVar321,auVar13);
  dVar4 = in_RSI[9];
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar4;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = in_RDX[9];
  auVar347._8_8_ = 0;
  auVar347._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar347,auVar375,auVar13);
  dVar4 = in_RSI[10];
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar4;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = in_RDX[10];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar388,auVar396,auVar13);
  dVar4 = in_RSI[0xb];
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar4;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = in_RDX[0xb];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = dVar4 + dVar4;
  auVar13 = vfmadd213sd_fma(auVar402,auVar408,auVar13);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar26,auVar375,auVar13);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = in_RDX[3] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar182,auVar132,auVar13);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar27,auVar396,auVar13);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = in_RDX[4] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar49,auVar283,auVar13);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar28,auVar408,auVar13);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = in_RDX[5] * -2.0;
  auVar13 = vfmadd213sd_fma(auVar50,auVar348,auVar13);
  *(long *)(ctx + 0x160) = auVar13._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar12 * dVar12 + auVar14._0_8_ * auVar14._0_8_ + auVar14._8_8_ * auVar14._8_8_;
  auVar13 = vsqrtsd_avx(auVar13,auVar13);
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[9];
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar4;
  dVar5 = in_RSI[10];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar5;
  dVar6 = in_RSI[0xb];
  auVar227._8_8_ = 0;
  auVar227._0_8_ = dVar6;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       dVar6 * dVar6 +
       (dVar1 * dVar1 - auVar13._0_8_ * auVar13._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4 + dVar5 * dVar5;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar29,auVar133,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar16,auVar183,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3 * -2.0;
  auVar13 = vfmadd213sd_fma(auVar14,auVar227,auVar13);
  *(long *)(ctx + 0x1b0) = auVar13._0_8_;
  return (int)in_stack_00000010;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp2::init(
    Eigen::Matrix<double,10,6> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();
  temp = c1-c3;
  double c13w = temp.norm()*temp.norm();

  groebnerMatrix(0,0) = ((((((((-2*m(0,0)*m(3,0)-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0))+pow(m(0,0),2))+pow(m(3,0),2))+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2));
  groebnerMatrix(0,1) = (((((((((((2*n(0,0)*m(0,0)-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0))-2*m(1,0)*n(4,0))+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0));
  groebnerMatrix(0,2) = ((((((((-2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0))+pow(n(0,0),2))+pow(n(3,0),2))+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2));
  groebnerMatrix(0,3) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,4) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,5) = (((((((((-c01w+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0))+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2));
  groebnerMatrix(1,0) = ((((((((-2*m(0,0)*m(6,0)-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(1,1) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0));
  groebnerMatrix(1,2) = ((((((((-2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(1,3) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(6,0))-2*m(0,0)*a(6,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0));
  groebnerMatrix(1,4) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(6,0))-2*n(0,0)*a(6,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0));
  groebnerMatrix(1,5) = (((((((((-c02w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2));
  groebnerMatrix(2,0) = ((((((((-2*m(0,0)*m(9,0)-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(2,1) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(9,0))-2*m(0,0)*n(9,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0));
  groebnerMatrix(2,2) = ((((((((-2*n(0,0)*n(9,0)-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(2,3) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(9,0))-2*m(0,0)*a(9,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0));
  groebnerMatrix(2,4) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(9,0))-2*n(0,0)*a(9,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0));
  groebnerMatrix(2,5) = (((((((((-c03w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2));
  groebnerMatrix(3,0) = ((((((((-2*m(3,0)*m(6,0)-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0))+pow(m(3,0),2))+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(3,1) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))-2*m(4,0)*n(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0));
  groebnerMatrix(3,2) = ((((((((-2*n(3,0)*n(6,0)-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0))+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(3,3) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*a(3,0)*m(6,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0));
  groebnerMatrix(3,4) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*a(3,0)*n(6,0))-2*n(3,0)*a(6,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0));
  groebnerMatrix(3,5) = (((((((((-c12w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))-2*a(5,0)*a(8,0));
  groebnerMatrix(4,0) = ((((((((-2*m(3,0)*m(9,0)-2*m(4,0)*m(10,0))-2*m(5,0)*m(11,0))+pow(m(3,0),2))+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(4,1) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(9,0)*m(9,0))+2*n(10,0)*m(10,0))+2*n(11,0)*m(11,0))-2*n(3,0)*m(9,0))-2*m(3,0)*n(9,0))-2*n(4,0)*m(10,0))-2*m(4,0)*n(10,0))-2*n(5,0)*m(11,0))-2*m(5,0)*n(11,0));
  groebnerMatrix(4,2) = ((((((((-2*n(3,0)*n(9,0)-2*n(4,0)*n(10,0))-2*n(5,0)*n(11,0))+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(4,3) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(9,0)*m(9,0))+2*a(10,0)*m(10,0))+2*a(11,0)*m(11,0))-2*a(3,0)*m(9,0))-2*m(3,0)*a(9,0))-2*a(4,0)*m(10,0))-2*m(4,0)*a(10,0))-2*a(5,0)*m(11,0))-2*m(5,0)*a(11,0));
  groebnerMatrix(4,4) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(9,0)*n(9,0))+2*a(10,0)*n(10,0))+2*a(11,0)*n(11,0))-2*a(3,0)*n(9,0))-2*n(3,0)*a(9,0))-2*a(4,0)*n(10,0))-2*n(4,0)*a(10,0))-2*a(5,0)*n(11,0))-2*n(5,0)*a(11,0));
  groebnerMatrix(4,5) = (((((((((-c13w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(9,0),2))+pow(a(10,0),2))+pow(a(11,0),2))-2*a(3,0)*a(9,0))-2*a(4,0)*a(10,0))-2*a(5,0)*a(11,0));
}